

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

int check_lookbehinds(compile_block_16 *cb)

{
  short sVar1;
  BOOL BVar2;
  int local_28;
  int local_24;
  int loopcount;
  int errorcode;
  uint32_t *pptr;
  compile_block_16 *cb_local;
  
  local_24 = 0;
  local_28 = 0;
  cb->erroroffset = 0xffffffffffffffff;
  _loopcount = cb->parsed_pattern;
  pptr = (uint32_t *)cb;
  do {
    if (*_loopcount == 0x80000000) {
      return 0;
    }
    if ((((0x7fffffff < *_loopcount) && (sVar1 = *(short *)((long)_loopcount + 2), sVar1 != -0x7fff)
         ) && (sVar1 != -0x7ffe)) && (sVar1 != -0x7ffd)) {
      if (sVar1 == -0x7ffc) {
LAB_0014964b:
        _loopcount = _loopcount + 3;
      }
      else if (sVar1 == -0x7ffb) {
LAB_00149667:
        _loopcount = _loopcount + 1;
      }
      else if (sVar1 == -0x7ffa) {
LAB_00149683:
        _loopcount = _loopcount + 3;
      }
      else if (sVar1 == -0x7ff9) {
        _loopcount = _loopcount + 5;
      }
      else if (((((sVar1 != -0x7ff8) && (sVar1 != -0x7ff7)) &&
                ((sVar1 != -0x7ff6 && ((sVar1 != -0x7ff5 && (sVar1 != -0x7ff4)))))) &&
               (sVar1 != -0x7ff3)) && ((sVar1 != -0x7ff2 && (sVar1 != -0x7ff1)))) {
        if ((sVar1 == -0x7ff0) ||
           ((((sVar1 == -0x7fef || (sVar1 == -0x7fee)) || (sVar1 == -0x7fed)) || (sVar1 == -0x7fec))
           )) goto LAB_0014964b;
        if (sVar1 == -0x7feb) goto LAB_00149683;
        if ((sVar1 != -0x7fea) && (sVar1 != -0x7fe9)) {
          if (sVar1 == -0x7fe8) {
            if ((*_loopcount == 0x8018000f) || (*_loopcount == 0x80180010)) {
              _loopcount = _loopcount + 1;
            }
          }
          else if ((sVar1 != -0x7fe7) && (sVar1 != -0x7fe6)) {
            if ((sVar1 == -0x7fe5) || ((sVar1 == -0x7fe4 || (sVar1 == -0x7fe3)))) goto LAB_00149667;
            if ((sVar1 != -0x7fe2) && (sVar1 != -0x7fe1)) {
              if (sVar1 == -0x7fe0) {
                _loopcount = _loopcount + 2;
              }
              else {
                if (sVar1 == -0x7fdf) goto LAB_0014964b;
                if ((sVar1 != -0x7fde) && (sVar1 != -0x7fdd)) {
                  if ((sVar1 == -0x7fdc) || (sVar1 == -0x7fdb)) {
                    BVar2 = set_lookbehind_lengths
                                      ((uint32_t **)&loopcount,&local_24,&local_28,
                                       (parsed_recurse_check *)0x0,(compile_block_16 *)pptr);
                    if (BVar2 == 0) {
                      return local_24;
                    }
                  }
                  else if (sVar1 == -0x7fda) {
LAB_00149691:
                    _loopcount = _loopcount + (_loopcount[1] + 1);
                  }
                  else if (((sVar1 != -0x7fd9) && (sVar1 != -0x7fd8)) && (sVar1 != -0x7fd7)) {
                    if (sVar1 == -0x7fd6) goto LAB_00149691;
                    if (sVar1 != -0x7fd5) {
                      if (sVar1 == -0x7fd4) goto LAB_00149691;
                      if (sVar1 != -0x7fd3) {
                        if (sVar1 == -0x7fd2) goto LAB_00149691;
                        if (sVar1 != -0x7fd1) {
                          if (sVar1 == -0x7fd0) goto LAB_00149691;
                          if ((((sVar1 != -0x7fcf) && (sVar1 != -0x7fce)) &&
                              ((sVar1 != -0x7fcd && ((sVar1 != -0x7fcc && (sVar1 != -0x7fcb)))))) &&
                             ((sVar1 != -0x7fca &&
                              (((sVar1 != -0x7fc9 && (sVar1 != -0x7fc8)) && (sVar1 != -0x7fc7))))))
                          {
                            if (((sVar1 != -0x7fc6) && (sVar1 != -0x7fc5)) && (sVar1 != -0x7fc4)) {
                              return 0xaa;
                            }
                            _loopcount = _loopcount + 2;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    _loopcount = _loopcount + 1;
  } while( true );
}

Assistant:

static int
check_lookbehinds(compile_block *cb)
{
uint32_t *pptr;
int errorcode = 0;
int loopcount = 0;

cb->erroroffset = PCRE2_UNSET;

for (pptr = cb->parsed_pattern; *pptr != META_END; pptr++)
  {
  if (*pptr < META_END) continue;  /* Literal */

  switch (META_CODE(*pptr))
    {
    default:
    return ERR70;  /* Unrecognized meta code */

    case META_ESCAPE:
    if (*pptr - META_ESCAPE == ESC_P || *pptr - META_ESCAPE == ESC_p)
      pptr += 1;
    break;

    case META_ACCEPT:
    case META_ALT:
    case META_ASTERISK:
    case META_ASTERISK_PLUS:
    case META_ASTERISK_QUERY:
    case META_ATOMIC:
    case META_BACKREF:
    case META_CAPTURE:
    case META_CIRCUMFLEX:
    case META_CLASS:
    case META_CLASS_EMPTY:
    case META_CLASS_EMPTY_NOT:
    case META_CLASS_END:
    case META_CLASS_NOT:
    case META_COMMIT:
    case META_COND_ASSERT:
    case META_DOLLAR:
    case META_DOT:
    case META_FAIL:
    case META_KET:
    case META_LOOKAHEAD:
    case META_LOOKAHEADNOT:
    case META_NOCAPTURE:
    case META_PLUS:
    case META_PLUS_PLUS:
    case META_PLUS_QUERY:
    case META_PRUNE:
    case META_QUERY:
    case META_QUERY_PLUS:
    case META_QUERY_QUERY:
    case META_RANGE_ESCAPED:
    case META_RANGE_LITERAL:
    case META_SKIP:
    case META_THEN:
    break;

    case META_RECURSE:
    pptr += SIZEOFFSET;
    break;

    case META_BACKREF_BYNAME:
    case META_COND_DEFINE:
    case META_COND_NAME:
    case META_COND_NUMBER:
    case META_COND_RNAME:
    case META_COND_RNUMBER:
    case META_RECURSE_BYNAME:
    pptr += 1 + SIZEOFFSET;
    break;

    case META_CALLOUT_STRING:
    pptr += 3 + SIZEOFFSET;
    break;

    case META_BIGVALUE:
    case META_OPTIONS:
    case META_POSIX:
    case META_POSIX_NEG:
    pptr += 1;
    break;

    case META_MINMAX:
    case META_MINMAX_QUERY:
    case META_MINMAX_PLUS:
    pptr += 2;
    break;

    case META_CALLOUT_NUMBER:
    case META_COND_VERSION:
    pptr += 3;
    break;

    case META_MARK:
    case META_COMMIT_ARG:
    case META_PRUNE_ARG:
    case META_SKIP_ARG:
    case META_THEN_ARG:
    pptr += 1 + pptr[1];
    break;

    case META_LOOKBEHIND:
    case META_LOOKBEHINDNOT:
    if (!set_lookbehind_lengths(&pptr, &errorcode, &loopcount, NULL, cb))
      return errorcode;
    break;
    }
  }

return 0;
}